

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_c_kernels.h
# Opt level: O3

void Sweeper_sweep_block_impl
               (SweeperLite sweeper,P *vo,P *vi,P *facexy,P *facexz,P *faceyz,P *a_from_m,
               P *m_from_a,int step,Quantities quan,Bool_t proc_x_min,Bool_t proc_x_max,
               Bool_t proc_y_min,Bool_t proc_y_max,StepInfoAll stepinfoall,
               unsigned_long do_block_init)

{
  P *v;
  int iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  double *pdVar28;
  ulong uVar29;
  P *pPVar30;
  bool bVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  double dVar45;
  ulong uVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  int iVar53;
  ulong uVar54;
  byte bVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  int iVar65;
  ulong uVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  long lVar70;
  double *pdVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  long lVar75;
  int iVar76;
  int iVar77;
  uint uVar78;
  byte bVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  ulong uVar86;
  int iVar87;
  ulong uVar88;
  byte bVar89;
  uint uVar90;
  uint uVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  bool bVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  P PVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  undefined8 in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab8;
  uint local_528;
  uint local_524;
  uint local_510;
  uint local_508;
  uint local_4b0;
  uint local_4ac;
  uint local_4a8;
  uint local_4a4;
  int local_428;
  uint local_408;
  uint local_404;
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  uint local_3d0;
  uint local_3cc;
  uint local_3c8;
  uint local_3c4;
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  uint local_3a0;
  uint local_39c;
  uint local_398;
  uint local_394;
  uint local_390;
  uint local_38c;
  uint local_388;
  double *local_1e8;
  P *local_1b0;
  P *local_1a8;
  P *local_1a0;
  P *local_198;
  P *local_190;
  P *local_188;
  P *local_180;
  P *local_178;
  P *local_170;
  P *local_168;
  P *local_160;
  P *local_158;
  
  if (0 < (long)sweeper.nsemiblock) {
    if (sweeper.nthread_y * sweeper.nthread_z * sweeper.nthread_octant * sweeper.nthread_e != 1) {
      __assert_fail("sweeper->nthread_e * sweeper->nthread_octant * sweeper->nthread_y * sweeper->nthread_z == 1 || Env_omp_in_parallel()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                    ,0x8f,"int Sweeper_thread_octant(const SweeperLite *)");
    }
    iVar58 = (sweeper.dims_b.ncell_x - (sweeper.dims_b.ncell_x + 1 >> 0x1f)) + 1 >> 1;
    iVar59 = (sweeper.dims_b.ncell_y - (sweeper.dims_b.ncell_y + 1 >> 0x1f)) + 1 >> 1;
    iVar60 = (sweeper.dims_b.ncell_z - (sweeper.dims_b.ncell_z + 1 >> 0x1f)) + 1 >> 1;
    uVar86 = (ulong)(uint)sweeper.dims_b.na;
    lVar25 = (long)sweeper.dims_b.nm;
    uVar26 = 0;
    if (0 < sweeper.dims_g.na) {
      uVar26 = (ulong)(uint)sweeper.dims_g.na;
    }
    lVar27 = (long)sweeper.noctant_per_block;
    iVar32 = sweeper.dims_b.ne * sweeper.dims_b.ncell_y;
    iVar72 = sweeper.dims_b.ncell_y * sweeper.dims_b.ncell_x * sweeper.dims_b.na * 4;
    iVar1 = sweeper.dims_b.ncell_x * sweeper.dims_b.na * 4;
    iVar73 = sweeper.dims_b.ncell_x * sweeper.dims_b.na * sweeper.dims_b.ncell_z * 4;
    iVar76 = sweeper.dims_b.ncell_y * sweeper.dims_b.na * sweeper.dims_b.ncell_z * 4;
    iVar33 = sweeper.dims_b.na * 4;
    lVar47 = 0;
    do {
      if (0 < (int)((long)sweeper.noctant_per_block / (long)sweeper.nthread_octant)) {
        if (8 < (uint)sweeper.nsemiblock) {
          __assert_fail("nsemiblock >= 0 && nsemiblock <= NOCTANT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                        ,0x193,"Bool_t is_axis_semiblocked(int, int)");
        }
        iVar24 = 0;
        iVar23 = 0;
        uVar54 = 0;
        do {
          uVar2 = stepinfoall.stepinfo[uVar54].octant;
          uVar80 = uVar2 & 1;
          uVar81 = uVar2 & 2;
          uVar90 = uVar2 & 4;
          bVar55 = uVar80 == 0 ^ (byte)lVar47;
          iVar34 = sweeper.dims_b.ncell_x;
          iVar61 = iVar58;
          if ((bVar55 & 1) != 0) {
            iVar61 = 0;
            iVar34 = iVar58;
          }
          if (sweeper.nsemiblock == 1) {
            iVar61 = 0;
            iVar34 = sweeper.dims_b.ncell_x;
          }
          bVar79 = uVar81 == 0 ^ (byte)(((uint)lVar47 & 2) >> 1);
          iVar35 = sweeper.dims_b.ncell_y;
          iVar77 = iVar59;
          if (bVar79 != 0) {
            iVar35 = iVar59;
            iVar77 = 0;
          }
          if ((uint)sweeper.nsemiblock < 3) {
            iVar77 = 0;
            iVar35 = sweeper.dims_b.ncell_y;
          }
          bVar89 = uVar90 == 0 ^ (byte)(((uint)lVar47 & 4) >> 2);
          iVar36 = sweeper.dims_b.ncell_z;
          iVar6 = iVar60;
          if (bVar89 != 0) {
            iVar36 = iVar60;
            iVar6 = 0;
          }
          if ((uint)sweeper.nsemiblock < 5) {
            iVar6 = 0;
            iVar36 = sweeper.dims_b.ncell_z;
          }
          if (vi == (P *)0x0) {
            __assert_fail("v",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc3,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.ncell_x < 1) {
            __assert_fail("ix >= 0 && ix < dims.ncell_x",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc5,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.ncell_y < 1) {
            __assert_fail("iy >= 0 && iy < dims.ncell_y",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc6,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          iVar7 = stepinfoall.stepinfo[uVar54].block_z * sweeper.dims_b.ncell_z;
          if ((iVar7 < 0) || (sweeper.dims.ncell_z <= iVar7)) {
            __assert_fail("iz >= 0 && iz < dims.ncell_z",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,199,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.ne < 1) {
            __assert_fail("ie >= 0 && ie < dims.ne",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,200,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.nm < 1) {
            __assert_fail("im >= 0 && im < dims.nm",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc9,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (vo == (P *)0x0) {
            __assert_fail("v",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0x89,
                          "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.ncell_x_per_subblock < 1) {
LAB_00108969:
            __assert_fail("j > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/definitions_kernels.h"
                          ,0x57,"int iceil(const int, const int)");
          }
          iVar3 = stepinfoall.stepinfo[uVar54].is_active;
          iVar34 = iVar34 - (((sweeper.nsemiblock == 1 ||
                              ((undefined1  [144])sweeper & (undefined1  [144])0x1) ==
                              (undefined1  [144])0x0) | bVar55) & 1);
          uVar8 = iVar34 - iVar61;
          if ((int)uVar8 < 0) {
            uVar8 = ~uVar8 / (uint)sweeper.ncell_x_per_subblock;
          }
          else {
            uVar8 = (int)-(uVar8 + sweeper.ncell_x_per_subblock) / sweeper.ncell_x_per_subblock;
          }
          if (sweeper.ncell_y_per_subblock < 1) goto LAB_00108969;
          iVar35 = iVar35 - (uint)(((uint)sweeper.nsemiblock < 3 ||
                                   ((undefined1  [144])sweeper & (undefined1  [144])0x100000000) ==
                                   (undefined1  [144])0x0) | bVar79);
          uVar9 = iVar35 - iVar77;
          if ((int)uVar9 < 0) {
            uVar9 = ~uVar9 / (uint)sweeper.ncell_y_per_subblock;
          }
          else {
            uVar9 = (int)-(uVar9 + sweeper.ncell_y_per_subblock) / sweeper.ncell_y_per_subblock;
          }
          if (sweeper.ncell_z_per_subblock < 1) goto LAB_00108969;
          iVar36 = iVar36 - (uint)(((uint)sweeper.nsemiblock < 5 ||
                                   ((undefined1  [144])sweeper & (undefined1  [144])0x1) ==
                                   (undefined1  [144])0x0) | bVar89);
          uVar10 = iVar36 - iVar6;
          if ((int)uVar10 < 0) {
            uVar10 = ~uVar10 / (uint)sweeper.ncell_z_per_subblock;
          }
          else {
            uVar10 = (int)-(uVar10 + sweeper.ncell_z_per_subblock) / sweeper.ncell_z_per_subblock;
          }
          if ((-1 < (int)uVar8) || (sweeper.nthread_y < 1)) goto LAB_00108969;
          if ((int)uVar9 < 0) {
            uVar11 = (int)((uVar9 - sweeper.nthread_y) + 1) / sweeper.nthread_y;
          }
          else {
            uVar11 = uVar9 / (uint)sweeper.nthread_y;
          }
          if (sweeper.nthread_z < 1) goto LAB_00108969;
          if ((int)uVar10 < 0) {
            uVar12 = (int)((uVar10 - sweeper.nthread_z) + 1) / sweeper.nthread_z;
          }
          else {
            uVar12 = uVar10 / (uint)sweeper.nthread_z;
          }
          if (-1 < (int)uVar11) goto LAB_00108969;
          uVar8 = -uVar8;
          iVar37 = -uVar11;
          iVar13 = (int)((uVar11 - sweeper.nthread_z) + 1) / iVar37;
          uVar14 = -iVar13;
          if (sweeper.nthread_y != uVar14 &&
              SBORROW4(sweeper.nthread_y,uVar14) == sweeper.nthread_y + iVar13 < 0) {
            uVar14 = sweeper.nthread_y;
          }
          if (uVar14 < uVar8) {
            uVar14 = uVar8;
          }
          iVar13 = uVar14 * uVar12 * uVar11;
          uVar15 = sweeper.nthread_y + -2 + sweeper.nthread_z + iVar13;
          if (0 < (int)uVar15) {
            iVar62 = sweeper.nthread_y + -1;
            if (uVar81 == 0) {
              iVar62 = 0;
            }
            iVar63 = sweeper.nthread_z + -1;
            if (uVar90 == 0) {
              iVar63 = 0;
            }
            uVar78 = -uVar80 | 1;
            uVar82 = -(uint)((uVar2 >> 1 & 1) != 0) | 1;
            uVar91 = -(uint)((uVar2 >> 2 & 1) != 0) | 1;
            uVar66 = (ulong)(uint)(iVar7 * sweeper.dims.ne * sweeper.dims.nm *
                                           sweeper.dims.ncell_x * sweeper.dims.ncell_y * 4);
            v = vo + uVar66;
            dVar109 = (double)(int)(uVar2 + 1);
            dVar96 = 1.0 / dVar109;
            iVar16 = sweeper.dims.ne / sweeper.nthread_e;
            iVar38 = iVar1 * uVar82;
            iVar48 = iVar33 * uVar78;
            iVar17 = iVar1 * uVar91;
            iVar18 = sweeper.dims_b.ncell_y * sweeper.dims_b.na * 4 * uVar91;
            iVar39 = iVar33 * uVar82;
            uVar19 = 0;
            do {
              uVar52 = ~uVar19 + iVar13;
              if (uVar80 == 0) {
                uVar52 = uVar19;
              }
              iVar49 = (int)uVar52 % (int)uVar14;
              uVar20 = uVar19 / uVar14;
              uVar64 = ~uVar20 + uVar12 * uVar11;
              uVar52 = uVar64;
              if (uVar90 == 0) {
                uVar52 = uVar20;
              }
              if (uVar81 == 0) {
                uVar64 = uVar20;
              }
              iVar50 = ((int)uVar64 % iVar37) * sweeper.nthread_y + iVar62;
              iVar92 = ((int)uVar52 / iVar37) * sweeper.nthread_z + iVar63;
              bVar4 = false;
              if ((((((int)uVar19 < iVar13) && (-1 < iVar92)) && (iVar92 < (int)-uVar10)) &&
                  ((-1 < iVar50 && (-1 < iVar49)))) && (iVar50 < (int)-uVar9)) {
                bVar4 = iVar49 < (int)uVar8;
              }
              iVar21 = sweeper.ncell_x_per_subblock * iVar49 + iVar61;
              iVar87 = (iVar49 + 1) * sweeper.ncell_x_per_subblock + iVar61 + -1;
              iVar40 = sweeper.ncell_y_per_subblock * iVar50 + iVar77;
              iVar51 = (iVar50 + 1) * sweeper.ncell_y_per_subblock + iVar77 + -1;
              iVar50 = sweeper.ncell_z_per_subblock * iVar92 + iVar6;
              iVar92 = (iVar92 + 1) * sweeper.ncell_z_per_subblock + iVar6 + -1;
              iVar49 = iVar87;
              if (uVar80 != 0) {
                iVar49 = iVar21;
                iVar21 = iVar87;
              }
              iVar87 = iVar51;
              if (uVar81 != 0) {
                iVar87 = iVar40;
                iVar40 = iVar51;
              }
              iVar51 = iVar92;
              if (uVar90 != 0) {
                iVar51 = iVar50;
                iVar50 = iVar92;
              }
              if (0 < iVar16) {
                iVar92 = (iVar23 + iVar40) * sweeper.dims_b.ncell_x + iVar21;
                local_528 = iVar33 * iVar92;
                iVar84 = sweeper.dims_b.ncell_x * (iVar24 + iVar50) + iVar21;
                uVar52 = iVar33 * iVar84;
                iVar41 = (iVar24 + iVar50) * sweeper.dims_b.ncell_y + iVar40;
                local_510 = iVar33 * iVar41;
                iVar74 = 0;
                do {
                  uVar64 = iVar74 * 0x556 + 0x24d69;
                  if (iVar50 != iVar51 + uVar91) {
                    dVar45 = (double)(1 << ((char)uVar64 + (char)(uVar64 / 0xae529) * -0x29 & 3U));
                    local_508 = uVar52;
                    iVar93 = iVar50;
                    uVar64 = local_510;
                    do {
                      if (iVar40 != uVar82 + iVar87) {
                        iVar43 = iVar93 + iVar7;
                        iVar85 = iVar43 - uVar91;
                        local_524 = uVar64;
                        iVar65 = iVar40;
                        uVar20 = local_528;
                        do {
                          if (iVar21 != uVar78 + iVar49) {
                            iVar94 = quan.iy_base + iVar65;
                            iVar53 = iVar94 - uVar82;
                            iVar83 = iVar21;
                            uVar22 = local_508;
                            uVar44 = uVar20;
                            do {
                              if (((iVar83 < sweeper.dims_b.ncell_x) &&
                                  (iVar65 < sweeper.dims_b.ncell_y)) &&
                                 (((iVar83 <= iVar34 && iVar65 <= iVar35) &&
                                  iVar93 < sweeper.dims_b.ncell_z) &&
                                  ((bVar4 && iVar3 != 0) && iVar93 <= iVar36))) {
                                if (iVar43 == sweeper.dims_g.ncell_z + -1 && uVar90 != 0 ||
                                    iVar43 == 0 && uVar90 == 0) {
                                  iVar56 = quan.ix_base + iVar83;
                                  iVar42 = 0;
                                  uVar57 = uVar44;
                                  do {
                                    iVar42 = iVar42 + 1;
                                    if (0 < sweeper.dims_b.na) {
                                      if (sweeper.dims_g.ncell_x <= iVar56 || iVar56 < 0) {
                                        __assert_fail("ix_g >= 0 && ix_g < dims_g.ncell_x",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xe6,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_y <= iVar94 || iVar94 < 0) {
                                        __assert_fail("iy_g >= 0 && iy_g < dims_g.ncell_y",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xe7,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if ((sweeper.dims_g.ncell_z != iVar85 || uVar90 == 0) &&
                                          (iVar85 != -1 || uVar90 != 0)) {
                                        __assert_fail(
                                                  "( iz_g == -1 && Dir_z(octant)==DIR_UP ) || ( iz_g == dims_g.ncell_z && Dir_z(octant)==DIR_DN )"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xe9,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ne <= iVar74) {
                                        __assert_fail("ie >= 0 && ie < dims_g.ne",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xea,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      uVar88 = 0;
                                      do {
                                        if (uVar26 == uVar88) {
                                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xeb,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (7 < uVar2) {
                                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xed,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (quan.ncell_x_g < iVar56) goto LAB_001081c8;
                                        if (quan.ncell_y_g < iVar94) goto LAB_001081e7;
                                        if (quan.ncell_z_g < iVar85 || iVar85 < -1)
                                        goto LAB_00108206;
                                        if (facexy == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1d8,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar83 < 0) {
                                          __assert_fail("ix >= 0 && ix < dims.ncell_x",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1da,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar65 < 0) {
                                          __assert_fail("iy >= 0 && iy < dims.ncell_y",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1db,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar74) {
                                          __assert_fail("ie >= 0 && ie < dims.ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1dc,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (lVar27 <= (long)uVar54) {
                                          __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1df,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        uVar46 = uVar88 + 1;
                                        facexy[uVar57 + uVar88] =
                                             (double)(1 << ((byte)uVar88 & 7)) * (double)(int)uVar46
                                             * (double)(1 << (((char)iVar85 + (char)iVar94) * '\x03'
                                                              + (char)iVar56 & 3U ^ 2)) * dVar45 *
                                             (double)(1 << ((byte)iVar42 & 3)) * dVar109;
                                        uVar88 = uVar46;
                                      } while (uVar86 != uVar46);
                                    }
                                    uVar57 = uVar57 + sweeper.dims_b.na;
                                  } while (iVar42 != 4);
                                }
                                iVar42 = quan.ix_base + iVar83;
                                if (iVar94 == sweeper.dims_g.ncell_y + -1 && uVar81 != 0 ||
                                    iVar94 == 0 && uVar81 == 0) {
                                  iVar56 = 0;
                                  uVar57 = uVar22;
                                  do {
                                    iVar56 = iVar56 + 1;
                                    if (0 < sweeper.dims_b.na) {
                                      if (sweeper.dims_g.ncell_x <= iVar42 || iVar42 < 0) {
                                        __assert_fail("ix_g >= 0 && ix_g < dims_g.ncell_x",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x110,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if ((sweeper.dims_g.ncell_y != iVar53 || uVar81 == 0) &&
                                          (iVar53 != -1 || uVar81 != 0)) {
                                        __assert_fail(
                                                  "( iy_g == -1 && Dir_y(octant)==DIR_UP ) || ( iy_g == dims_g.ncell_y && Dir_y(octant)==DIR_DN )"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x112,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_z <= iVar43 || iVar43 < 0) {
                                        __assert_fail("iz_g >= 0 && iz_g < dims_g.ncell_z",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x113,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ne <= iVar74) {
                                        __assert_fail("ie >= 0 && ie < dims_g.ne",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x114,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      uVar88 = 0;
                                      do {
                                        if (uVar26 == uVar88) {
                                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x115,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (7 < uVar2) {
                                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x117,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (quan.ncell_x_g < iVar42) goto LAB_001081c8;
                                        if (quan.ncell_y_g < iVar53 || iVar53 < -1)
                                        goto LAB_001081e7;
                                        if (quan.ncell_z_g < iVar43) goto LAB_00108206;
                                        if (facexz == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x218,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar83 < 0) {
                                          __assert_fail("ix >= 0 && ix < dims.ncell_x",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21a,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar93 < 0) {
                                          __assert_fail("iz >= 0 && iz < dims.ncell_z",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21b,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar74) {
                                          __assert_fail("ie >= 0 && ie < dims.ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21c,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (lVar27 <= (long)uVar54) {
                                          __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21f,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        uVar46 = uVar88 + 1;
                                        facexz[uVar57 + uVar88] =
                                             (double)(1 << ((byte)uVar88 & 7)) * (double)(int)uVar46
                                             * (double)(1 << (((char)iVar53 + (char)iVar43) * '\x03'
                                                              + (char)iVar42 & 3U ^ 2)) * dVar45 *
                                             (double)(1 << ((byte)iVar56 & 3)) * dVar109;
                                        uVar88 = uVar46;
                                      } while (uVar86 != uVar46);
                                    }
                                    uVar57 = uVar57 + sweeper.dims_b.na;
                                  } while (iVar56 != 4);
                                }
                                if ((iVar42 == 0 && uVar80 == 0) ||
                                   (uVar80 != 0 && iVar42 == sweeper.dims_g.ncell_x + -1)) {
                                  iVar42 = iVar42 - uVar78;
                                  iVar56 = 0;
                                  uVar57 = local_524;
                                  do {
                                    iVar56 = iVar56 + 1;
                                    if (0 < sweeper.dims_b.na) {
                                      if ((sweeper.dims_g.ncell_x != iVar42 || uVar80 == 0) &&
                                          (iVar42 != -1 || uVar80 != 0)) {
                                        __assert_fail(
                                                  "( ix_g == -1 && Dir_x(octant)==DIR_UP ) || ( ix_g == dims_g.ncell_x && Dir_x(octant)==DIR_DN )"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x137,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_y <= iVar94 || iVar94 < 0) {
                                        __assert_fail("iy_g >= 0 && iy_g < dims_g.ncell_y",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x138,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_z <= iVar43 || iVar43 < 0) {
                                        __assert_fail("iz_g >= 0 && iz_g < dims_g.ncell_z",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x139,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ne <= iVar74) {
                                        __assert_fail("ie >= 0 && ie < dims_g.ne",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x13a,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      uVar88 = 0;
                                      do {
                                        if (uVar26 == uVar88) {
                                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x13b,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (7 < uVar2) {
                                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x13d,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (quan.ncell_x_g < iVar42 || iVar42 < -1)
                                        goto LAB_001081c8;
                                        if (quan.ncell_y_g < iVar94) goto LAB_001081e7;
                                        if (quan.ncell_z_g < iVar43) goto LAB_00108206;
                                        if (faceyz == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,600,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar65 < 0) {
                                          __assert_fail("iy >= 0 && iy < dims.ncell_y",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25a,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar93 < 0) {
                                          __assert_fail("iz >= 0 && iz < dims.ncell_z",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25b,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar74) {
                                          __assert_fail("ie >= 0 && ie < dims.ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25c,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (lVar27 <= (long)uVar54) {
                                          __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25f,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        uVar46 = uVar88 + 1;
                                        faceyz[uVar57 + uVar88] =
                                             (double)(1 << ((byte)uVar88 & 7)) * (double)(int)uVar46
                                             * (double)(1 << (((char)iVar94 + (char)iVar43) * '\x03'
                                                              + (char)iVar42 & 3U ^ 2)) * dVar45 *
                                             (double)(1 << ((byte)iVar56 & 3)) * dVar109;
                                        uVar88 = uVar46;
                                      } while (uVar86 != uVar46);
                                    }
                                    uVar57 = uVar57 + sweeper.dims_b.na;
                                  } while (iVar56 != 4);
                                }
                              }
                              uVar44 = uVar44 + iVar48;
                              uVar22 = uVar22 + iVar48;
                              bVar95 = iVar83 != iVar49;
                              iVar83 = uVar78 + iVar83;
                            } while (bVar95);
                          }
                          uVar20 = uVar20 + iVar38;
                          local_524 = local_524 + iVar39;
                          bVar95 = iVar65 != iVar87;
                          iVar65 = uVar82 + iVar65;
                        } while (bVar95);
                      }
                      local_508 = local_508 + iVar17;
                      uVar64 = uVar64 + iVar18;
                      bVar95 = iVar93 != iVar51;
                      iVar93 = uVar91 + iVar93;
                    } while (bVar95);
                  }
                  iVar74 = iVar74 + 1;
                  local_528 = local_528 + iVar72;
                  uVar52 = uVar52 + iVar73;
                  local_510 = local_510 + iVar76;
                } while (iVar16 != iVar74);
                local_4b0 = ((iVar32 * iVar50 + iVar40) * sweeper.dims_b.ncell_x + iVar21) * 0x40;
                local_3f4 = (iVar41 * 4 + 3) * sweeper.dims_b.na;
                local_3f8 = (iVar84 * 4 + 3) * sweeper.dims_b.na;
                local_3e8 = (iVar92 * 4 + 3) * sweeper.dims_b.na;
                local_3fc = (iVar41 * 4 + 2) * sweeper.dims_b.na;
                local_400 = (iVar84 * 4 + 2) * sweeper.dims_b.na;
                local_3ec = (iVar92 * 4 + 2) * sweeper.dims_b.na;
                local_404 = (iVar41 * 4 + 1) * sweeper.dims_b.na;
                local_408 = (iVar84 * 4 + 1) * sweeper.dims_b.na;
                local_3f0 = (iVar92 * 4 + 1) * sweeper.dims_b.na;
                uVar52 = iVar41 * iVar33;
                uVar64 = iVar84 * iVar33;
                uVar20 = iVar92 * iVar33;
                iVar92 = 0;
                do {
                  if (iVar50 != iVar51 + uVar91) {
                    local_3cc = local_408;
                    local_3dc = local_404;
                    local_3d0 = local_400;
                    local_3e0 = local_3fc;
                    local_3d4 = local_3f8;
                    local_3e4 = local_3f4;
                    local_4ac = local_4b0;
                    local_3d8 = uVar52;
                    local_3c8 = uVar64;
                    iVar41 = iVar50;
                    do {
                      if (iVar40 != uVar82 + iVar87) {
                        iVar84 = iVar41 + iVar7;
                        iVar93 = iVar84 + (-(uint)(uVar2 < 4) | 1);
                        local_3ac = local_3d8;
                        local_3b0 = local_3f0;
                        local_3b4 = local_3dc;
                        local_3b8 = local_3ec;
                        local_3bc = local_3e0;
                        local_3c0 = local_3e8;
                        local_3c4 = local_3e4;
                        local_4a8 = local_4ac;
                        local_3a8 = uVar20;
                        iVar74 = iVar40;
                        do {
                          if (iVar21 != uVar78 + iVar49) {
                            iVar83 = quan.iy_base + iVar74;
                            iVar65 = (iVar83 + iVar84) * 3;
                            iVar43 = (uint)(uVar81 != 0) * 2 + -1 + iVar83;
                            local_388 = local_3a8;
                            local_38c = local_3c8;
                            local_390 = local_3b0;
                            local_394 = local_3cc;
                            local_398 = local_3b8;
                            local_39c = local_3d0;
                            local_3a0 = local_3c0;
                            local_3a4 = local_3d4;
                            local_4a4 = local_4a8;
                            iVar85 = iVar21;
                            do {
                              bVar95 = false;
                              if ((iVar85 < sweeper.dims_b.ncell_x) &&
                                 (iVar74 < sweeper.dims_b.ncell_y)) {
                                bVar95 = (bool)((iVar85 <= iVar34 && iVar41 < sweeper.dims_b.ncell_z
                                                ) & iVar3 != 0 & bVar4 & iVar41 <= iVar36 &
                                               iVar74 <= iVar35);
                              }
                              if (0 < sweeper.dims_b.na) {
                                local_158 = facexz + local_3a4;
                                local_160 = facexy + local_3a0;
                                local_168 = facexz + local_39c;
                                local_170 = facexy + local_398;
                                local_178 = facexz + local_394;
                                local_180 = facexy + local_390;
                                iVar94 = quan.ix_base + iVar85;
                                uVar44 = iVar65 + iVar94 & 3U ^ 2;
                                dVar97 = (double)(1 << (sbyte)uVar44);
                                dVar45 = (double)(((ulong)uVar44 ^ 0x3ff) << 0x34);
                                iVar53 = iVar94 + (-(uint)(uVar80 == 0) | 1);
                                dVar67 = (double)(((ulong)(iVar65 + iVar53 & 3U ^ 2) ^ 0x3ff) <<
                                                 0x34);
                                dVar68 = (double)(((ulong)((iVar84 + iVar43) * 3 + iVar94 & 3U ^ 2)
                                                  ^ 0x3ff) << 0x34);
                                dVar69 = (double)(((ulong)((iVar93 + iVar83) * 3 + iVar94 & 3U ^ 2)
                                                  ^ 0x3ff) << 0x34);
                                local_188 = facexz + local_38c;
                                local_190 = facexy + local_388;
                                uVar88 = 0;
                                local_528 = sweeper.dims_b.na * 0x10 * uVar2;
                                local_1e8 = (double *)
                                            ((ulong)(uVar2 << 4) * uVar86 * 8 + (long)a_from_m);
                                local_1b0 = faceyz + local_3c4;
                                local_1a8 = faceyz + local_3bc;
                                local_1a0 = faceyz + local_3b4;
                                local_198 = faceyz + local_3ac;
                                do {
                                  lVar70 = 0;
                                  bVar5 = true;
                                  do {
                                    bVar31 = bVar5;
                                    lVar75 = 0;
                                    do {
                                      if ((bool)(uVar88 == 0 & bVar95)) {
                                        if (iVar85 < 0 || sweeper.dims_b.ncell_x <= iVar85) {
                                          __assert_fail("ix >= 0 && ix < dims_ncell_x",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xa9,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ncell_y <= iVar74 || iVar74 < 0) {
                                          __assert_fail("iy >= 0 && iy < dims_ncell_y",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xaa,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ncell_z <= iVar41 || iVar41 < 0) {
                                          __assert_fail("iz >= 0 && iz < dims_ncell_z",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xab,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar92) {
                                          __assert_fail("ie >= 0 && ie < dims_ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xac,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.vilocal_host_ == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xda,
                                                  "P *ref_vilocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                                  );
                                        }
                                        sweeper.vilocal_host_[lVar70 + lVar75] =
                                             vi[uVar66 + (ulong)local_4a4 + lVar70 + lVar75];
                                        sweeper.vilocal_host_[lVar70 + lVar75 + 0x20] =
                                             vi[uVar66 + (ulong)local_4a4 + lVar70 + lVar75 + 0x20];
                                      }
                                      lVar75 = lVar75 + 1;
                                    } while (lVar75 != 0x10);
                                    lVar70 = 0x10;
                                    bVar5 = false;
                                  } while (bVar31);
                                  uVar46 = 0;
                                  pdVar28 = local_1e8;
                                  do {
                                    if ((uVar46 | uVar88) < uVar86 && bVar95) {
                                      if (a_from_m == (P *)0x0) {
                                        __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x180,
                                                  "const P *restrict const_ref_a_from_m_flat(const P *const restrict, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if (7 < uVar2) {
                                        __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x183,
                                                  "const P *restrict const_ref_a_from_m_flat(const P *const restrict, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if (sweeper.vilocal_host_ == (P *)0x0) {
                                        __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xef,
                                                  "const P *const_ref_vilocal(const P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                                  );
                                      }
                                      dVar98 = 0.0;
                                      dVar100 = 0.0;
                                      lVar70 = -0x80;
                                      dVar101 = 0.0;
                                      dVar102 = 0.0;
                                      pdVar71 = pdVar28;
                                      do {
                                        dVar103 = *pdVar71;
                                        dVar101 = dVar101 + *(double *)
                                                             ((long)sweeper.vilocal_host_ +
                                                             lVar70 + 0x180) * dVar103;
                                        dVar102 = dVar102 + *(double *)
                                                             ((long)sweeper.vilocal_host_ +
                                                             lVar70 + 0x200) * dVar103;
                                        dVar98 = dVar98 + *(double *)
                                                           ((long)sweeper.vilocal_host_ +
                                                           lVar70 + 0x80) * dVar103;
                                        dVar100 = dVar100 + *(double *)
                                                             ((long)sweeper.vilocal_host_ +
                                                             lVar70 + 0x100) * dVar103;
                                        pdVar71 = pdVar71 + uVar86;
                                        lVar70 = lVar70 + 8;
                                      } while (lVar70 != 0);
                                      sweeper.vslocal_host_[uVar46] = dVar98;
                                      sweeper.vslocal_host_[uVar46 + 0x20] = dVar100;
                                      sweeper.vslocal_host_[uVar46 + 0x40] = dVar101;
                                      sweeper.vslocal_host_[uVar46 + 0x60] = dVar102;
                                    }
                                    uVar46 = uVar46 + 1;
                                    pdVar28 = pdVar28 + 1;
                                  } while (uVar46 != 0x20);
                                  lVar70 = 0;
                                  do {
                                    if (sweeper.vslocal_host_ == (P *)0x0) {
                                      __assert_fail("vslocal",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x168,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (facexy == (P *)0x0) {
                                      __assert_fail("facexy",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x16f,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (facexz == (P *)0x0) {
                                      __assert_fail("facexz",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x170,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (faceyz == (P *)0x0) {
                                      __assert_fail("faceyz",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x171,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (iVar85 < 0) {
                                      if (bVar95) goto LAB_0010875a;
                                    }
                                    else {
                                      if ((bool)(sweeper.dims_b.ncell_x <= iVar85 & bVar95)) {
LAB_0010875a:
                                        __assert_fail(
                                                  "( ix_b >= 0 && ix_b < dims_b.ncell_x ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x172,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                      }
                                      if (iVar74 < 0) {
                                        if (bVar95) goto LAB_00108871;
                                      }
                                      else if ((bool)(sweeper.dims_b.ncell_y <= iVar74 & bVar95)) {
LAB_00108871:
                                        __assert_fail(
                                                  "( iy_b >= 0 && iy_b < dims_b.ncell_y ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x173,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                      }
                                    }
                                    if (iVar41 < 0) {
                                      if (bVar95) goto LAB_0010871c;
                                    }
                                    else {
                                      if ((bool)(sweeper.dims_b.ncell_z <= iVar41 & bVar95)) {
LAB_0010871c:
                                        __assert_fail(
                                                  "( iz_b >= 0 && iz_b < dims_b.ncell_z ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x174,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                      }
                                      if (iVar94 < 0) {
                                        if (bVar95) goto LAB_00108833;
                                      }
                                      else if ((bool)(sweeper.dims_g.ncell_x <= iVar94 & bVar95)) {
LAB_00108833:
                                        __assert_fail(
                                                  "( ix_g >= 0 && ix_g < dims_g.ncell_x ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x175,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                      }
                                    }
                                    if (iVar83 < 0) {
                                      if (bVar95) goto LAB_00108798;
                                    }
                                    else {
                                      if ((bool)(sweeper.dims_g.ncell_y <= iVar83 & bVar95)) {
LAB_00108798:
                                        __assert_fail(
                                                  "( iy_g >= 0 && iy_g < dims_g.ncell_y ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x176,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                      }
                                      if (iVar84 < 0) {
                                        if (bVar95) goto LAB_00108852;
                                      }
                                      else if ((bool)(sweeper.dims_g.ncell_z <= iVar84 & bVar95)) {
LAB_00108852:
                                        __assert_fail(
                                                  "( iz_g >= 0 && iz_g < dims_g.ncell_z ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x177,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                      }
                                    }
                                    if (sweeper.dims_b.ne <= iVar92) {
                                      __assert_fail("ie >= 0 && ie < dims_b.ne",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x178,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (7 < uVar2) {
                                      __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x179,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (lVar27 <= (long)uVar54) {
                                      __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x17a,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if ((bVar95) && (uVar88 + lVar70 < uVar86)) {
                                      if (quan.ncell_x_g < iVar94 || iVar94 < -1) {
LAB_001081c8:
                                        __assert_fail("ix_g >= -1 && ix_g <= quan->ncell_x_g",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x69,
                                                  "int Quantities_scalefactor_space_(const Quantities *, int, int, int)"
                                                  );
                                      }
                                      if (quan.ncell_y_g < iVar83 || iVar83 < -1) {
LAB_001081e7:
                                        __assert_fail("iy_g >= -1 && iy_g <= quan->ncell_y_g",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x6a,
                                                  "int Quantities_scalefactor_space_(const Quantities *, int, int, int)"
                                                  );
                                      }
                                      if (quan.ncell_z_g < iVar84 || iVar84 < -1) {
LAB_00108206:
                                        __assert_fail("iz_g >= -1 && iz_g <= quan->ncell_z_g",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x6b,
                                                  "int Quantities_scalefactor_space_(const Quantities *, int, int, int)"
                                                  );
                                      }
                                      if (quan.ncell_x_g < iVar53 || iVar53 < -1) goto LAB_001081c8;
                                      if (quan.ncell_y_g < iVar43 || iVar43 < -1) goto LAB_001081e7;
                                      if (quan.ncell_z_g < iVar93 || iVar93 < -1) goto LAB_00108206;
                                      dVar98 = (double)(((ulong)((uint)lVar70 & 7) ^
                                                        0xfffffffffffffbff) << 0x34) + 0.25;
                                      if (iVar85 < 0 || sweeper.dims_b.ncell_x <= iVar85) {
                                        __assert_fail("ix >= 0 && ix < dims.ncell_x",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1fa,
                                                  "const P *const_ref_facexy(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if (sweeper.dims_b.ncell_y <= iVar74 || iVar74 < 0) {
                                        __assert_fail("iy >= 0 && iy < dims.ncell_y",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1fb,
                                                  "const P *const_ref_facexy(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if ((long)sweeper.dims_g.na <= (long)(uVar88 + lVar70)) {
                                        __assert_fail("ia >= 0 && ia < dims.na",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x96,"P Quantities_xfluxweight_(Dimensions, int)"
                                                  );
                                      }
                                      if (sweeper.dims_b.ncell_z <= iVar41 || iVar41 < 0) {
                                        __assert_fail("iz >= 0 && iz < dims.ncell_z",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x23b,
                                                  "const P *const_ref_facexz(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      dVar100 = (sweeper.vslocal_host_[lVar70] * dVar45 +
                                                (local_198[lVar70] * dVar98 * dVar67 +
                                                local_190[lVar70] * 0.5 * dVar69 +
                                                local_188[lVar70] * 0.25 * dVar68) * dVar96) *
                                                dVar97;
                                      sweeper.vslocal_host_[lVar70] = dVar100;
                                      dVar100 = dVar100 * dVar109;
                                      local_190[lVar70] = dVar100;
                                      local_188[lVar70] = dVar100;
                                      local_198[lVar70] = dVar100;
                                      dVar100 = (sweeper.vslocal_host_[lVar70 + 0x20] * dVar45 +
                                                (local_1a0[lVar70] * dVar98 * dVar67 +
                                                local_180[lVar70] * 0.5 * dVar69 +
                                                local_178[lVar70] * 0.25 * dVar68) * dVar96) *
                                                dVar97;
                                      sweeper.vslocal_host_[lVar70 + 0x20] = dVar100;
                                      dVar100 = dVar100 * dVar109;
                                      local_180[lVar70] = dVar100;
                                      local_178[lVar70] = dVar100;
                                      local_1a0[lVar70] = dVar100;
                                      dVar100 = (sweeper.vslocal_host_[lVar70 + 0x40] * dVar45 +
                                                (local_1a8[lVar70] * dVar98 * dVar67 +
                                                local_170[lVar70] * 0.5 * dVar69 +
                                                local_168[lVar70] * 0.25 * dVar68) * dVar96) *
                                                dVar97;
                                      sweeper.vslocal_host_[lVar70 + 0x40] = dVar100;
                                      dVar100 = dVar100 * dVar109;
                                      local_170[lVar70] = dVar100;
                                      local_168[lVar70] = dVar100;
                                      local_1a8[lVar70] = dVar100;
                                      dVar98 = (sweeper.vslocal_host_[lVar70 + 0x60] * dVar45 +
                                               (dVar98 * local_1b0[lVar70] * dVar67 +
                                               local_160[lVar70] * 0.5 * dVar69 +
                                               local_158[lVar70] * 0.25 * dVar68) * dVar96) * dVar97
                                      ;
                                      sweeper.vslocal_host_[lVar70 + 0x60] = dVar98;
                                      dVar98 = dVar98 * dVar109;
                                      local_160[lVar70] = dVar98;
                                      local_158[lVar70] = dVar98;
                                      local_1b0[lVar70] = dVar98;
                                    }
                                    lVar70 = lVar70 + 1;
                                  } while (lVar70 != 0x20);
                                  uVar46 = 0;
                                  bVar5 = true;
                                  do {
                                    bVar31 = bVar5;
                                    uVar29 = uVar46 | 2;
                                    lVar70 = 0;
                                    uVar44 = local_528;
                                    do {
                                      local_428 = (int)(uVar88 + 0x20);
                                      if (bVar95) {
                                        dVar98 = 0.0;
                                        dVar100 = 0.0;
                                        lVar75 = 0;
                                        uVar22 = uVar44;
                                        do {
                                          dVar101 = 0.0;
                                          dVar102 = 0.0;
                                          if (uVar88 + lVar75 < uVar86) {
                                            if (lVar25 <= lVar70) goto LAB_001084b0;
                                            dVar101 = sweeper.vslocal_host_[uVar46 * 0x20 + lVar75]
                                                      * m_from_a[uVar22];
                                            dVar102 = sweeper.vslocal_host_
                                                      [uVar46 * 0x20 + lVar75 + 0x40] *
                                                      m_from_a[uVar22];
                                          }
                                          dVar103 = 0.0;
                                          dVar104 = 0.0;
                                          dVar105 = 0.0;
                                          dVar106 = 0.0;
                                          if (uVar88 + lVar75 + 1 < uVar86) {
                                            if (lVar25 <= lVar70) goto LAB_001084b0;
                                            dVar105 = sweeper.vslocal_host_
                                                      [uVar46 * 0x20 + lVar75 + 1] *
                                                      m_from_a[uVar22 + 0x10];
                                            dVar106 = sweeper.vslocal_host_
                                                      [uVar46 * 0x20 + lVar75 + 0x41] *
                                                      m_from_a[uVar22 + 0x10];
                                          }
                                          if (uVar88 + lVar75 + 2 < uVar86) {
                                            if (lVar25 <= lVar70) goto LAB_001084b0;
                                            dVar103 = sweeper.vslocal_host_
                                                      [uVar46 * 0x20 + lVar75 + 2] *
                                                      m_from_a[uVar22 + 0x20];
                                            dVar104 = sweeper.vslocal_host_
                                                      [uVar46 * 0x20 + lVar75 + 0x42] *
                                                      m_from_a[uVar22 + 0x20];
                                          }
                                          dVar107 = 0.0;
                                          dVar108 = 0.0;
                                          if (uVar88 + lVar75 + 3 < uVar86) {
                                            if (lVar25 <= lVar70) {
LAB_001084b0:
                                              __assert_fail("im >= 0 && im < dims_nm",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1bf,
                                                  "int ind_m_from_a_flat(const int, const int, const int, const int, const int)"
                                                  );
                                            }
                                            dVar107 = sweeper.vslocal_host_
                                                      [uVar46 * 0x20 + lVar75 + 3] *
                                                      m_from_a[uVar22 + 0x30];
                                            dVar108 = sweeper.vslocal_host_
                                                      [uVar46 * 0x20 + lVar75 + 0x43] *
                                                      m_from_a[uVar22 + 0x30];
                                          }
                                          dVar98 = dVar98 + dVar101 + dVar105 + dVar103 + dVar107;
                                          dVar100 = dVar100 + dVar102 + dVar106 + dVar104 + dVar108;
                                          lVar75 = lVar75 + 4;
                                          uVar22 = uVar22 + 0x40;
                                        } while (lVar75 != 0x20);
                                        if (uVar88 == 0) {
                                          if (sweeper.volocal_host_ == (P *)0x0) goto LAB_00108643;
                                          sweeper.volocal_host_[uVar46 * 0x10 + lVar70] = dVar98;
                                          sweeper.volocal_host_[uVar46 * 0x10 + lVar70 + 0x20] =
                                               dVar100;
                                        }
                                        else {
                                          if (sweeper.volocal_host_ == (P *)0x0) {
LAB_00108643:
                                            __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x141,
                                                  "P *ref_volocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                                  );
                                          }
                                          dVar98 = sweeper.volocal_host_[uVar46 * 0x10 + lVar70] +
                                                   dVar98;
                                          sweeper.volocal_host_[uVar46 * 0x10 + lVar70] = dVar98;
                                          sweeper.volocal_host_[uVar46 * 0x10 + lVar70 + 0x20] =
                                               dVar100 + sweeper.volocal_host_
                                                         [uVar46 * 0x10 + lVar70 + 0x20];
                                        }
                                        if (sweeper.dims_b.na <= local_428) {
                                          iVar42 = (int)lVar70;
                                          pPVar30 = ref_state_flat(v,sweeper.dims_b.ncell_x,
                                                                   sweeper.dims_b.ncell_y,
                                                                   sweeper.dims_b.ncell_z,
                                                                   sweeper.dims_b.ne,iVar85,iVar74,
                                                                   iVar41,iVar92,iVar42,(int)uVar46,
                                                                   (int)in_stack_fffffffffffffab0,
                                                                   in_stack_fffffffffffffab8);
                                          if ((1L << ((byte)lVar47 * (char)sweeper.noctant_per_block
                                                      + (char)uVar54 & 0x3f) & do_block_init) == 0)
                                          {
                                            *pPVar30 = dVar98 + *pPVar30;
                                            dVar98 = sweeper.volocal_host_[uVar29 * 0x10 + lVar70];
                                            pPVar30 = ref_state_flat(v,sweeper.dims_b.ncell_x,
                                                                     sweeper.dims_b.ncell_y,
                                                                     sweeper.dims_b.ncell_z,
                                                                     sweeper.dims_b.ne,iVar85,iVar74
                                                                     ,iVar41,iVar92,iVar42,
                                                                     (int)uVar29,
                                                                     (int)in_stack_fffffffffffffab0,
                                                                     in_stack_fffffffffffffab8);
                                            PVar99 = dVar98 + *pPVar30;
                                          }
                                          else {
                                            *pPVar30 = dVar98;
                                            PVar99 = sweeper.volocal_host_[uVar29 * 0x10 + lVar70];
                                            pPVar30 = ref_state_flat(v,sweeper.dims_b.ncell_x,
                                                                     sweeper.dims_b.ncell_y,
                                                                     sweeper.dims_b.ncell_z,
                                                                     sweeper.dims_b.ne,iVar85,iVar74
                                                                     ,iVar41,iVar92,iVar42,
                                                                     (int)uVar29,
                                                                     (int)in_stack_fffffffffffffab0,
                                                                     in_stack_fffffffffffffab8);
                                          }
                                          *pPVar30 = PVar99;
                                        }
                                      }
                                      lVar70 = lVar70 + 1;
                                      uVar44 = uVar44 + 1;
                                    } while (lVar70 != 0x10);
                                    uVar46 = 1;
                                    bVar5 = false;
                                  } while (bVar31);
                                  local_1e8 = local_1e8 + 0x20;
                                  local_1b0 = local_1b0 + 0x20;
                                  local_158 = local_158 + 0x20;
                                  local_160 = local_160 + 0x20;
                                  local_1a8 = local_1a8 + 0x20;
                                  local_168 = local_168 + 0x20;
                                  local_170 = local_170 + 0x20;
                                  local_1a0 = local_1a0 + 0x20;
                                  local_178 = local_178 + 0x20;
                                  local_180 = local_180 + 0x20;
                                  local_198 = local_198 + 0x20;
                                  local_188 = local_188 + 0x20;
                                  local_190 = local_190 + 0x20;
                                  local_528 = local_528 + 0x200;
                                  uVar88 = uVar88 + 0x20;
                                } while (local_428 < sweeper.dims_b.na);
                              }
                              local_4a4 = local_4a4 + uVar78 * 0x40;
                              local_3a4 = local_3a4 + iVar48;
                              local_3a0 = local_3a0 + iVar48;
                              local_39c = local_39c + iVar48;
                              local_398 = local_398 + iVar48;
                              local_394 = local_394 + iVar48;
                              local_390 = local_390 + iVar48;
                              local_38c = local_38c + iVar48;
                              local_388 = local_388 + iVar48;
                              bVar95 = iVar85 != iVar49;
                              iVar85 = uVar78 + iVar85;
                            } while (bVar95);
                          }
                          local_4a8 = local_4a8 + sweeper.dims_b.ncell_x * 0x40 * uVar82;
                          local_3c4 = local_3c4 + iVar39;
                          local_3c0 = local_3c0 + iVar38;
                          local_3bc = local_3bc + iVar39;
                          local_3b8 = local_3b8 + iVar38;
                          local_3b4 = local_3b4 + iVar39;
                          local_3b0 = local_3b0 + iVar38;
                          local_3ac = local_3ac + iVar39;
                          local_3a8 = local_3a8 + iVar38;
                          bVar95 = iVar74 != iVar87;
                          iVar74 = iVar74 + uVar82;
                        } while (bVar95);
                      }
                      local_4ac = local_4ac + iVar32 * sweeper.dims_b.ncell_x * 0x40 * uVar91;
                      local_3e4 = local_3e4 + iVar18;
                      local_3d4 = local_3d4 + iVar17;
                      local_3e0 = local_3e0 + iVar18;
                      local_3d0 = local_3d0 + iVar17;
                      local_3dc = local_3dc + iVar18;
                      local_3cc = local_3cc + iVar17;
                      local_3d8 = local_3d8 + iVar18;
                      local_3c8 = local_3c8 + iVar17;
                      bVar95 = iVar41 != iVar51;
                      iVar41 = iVar41 + uVar91;
                    } while (bVar95);
                  }
                  iVar92 = iVar92 + 1;
                  local_4b0 = local_4b0 + sweeper.dims_b.ncell_y * sweeper.dims_b.ncell_x * 0x40;
                  local_3f4 = local_3f4 + iVar76;
                  local_3f8 = local_3f8 + iVar73;
                  local_3e8 = local_3e8 + iVar72;
                  local_3fc = local_3fc + iVar76;
                  local_400 = local_400 + iVar73;
                  local_3ec = local_3ec + iVar72;
                  local_404 = local_404 + iVar76;
                  local_408 = local_408 + iVar73;
                  local_3f0 = local_3f0 + iVar72;
                  uVar52 = uVar52 + iVar76;
                  uVar64 = uVar64 + iVar73;
                  uVar20 = uVar20 + iVar72;
                } while (iVar92 != iVar16);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar15);
          }
          uVar54 = uVar54 + 1;
          iVar23 = iVar23 + iVar32;
          iVar24 = iVar24 + sweeper.dims_b.ne * sweeper.dims_b.ncell_z;
        } while (uVar54 != ((long)sweeper.noctant_per_block / (long)sweeper.nthread_octant &
                           0xffffffffU));
      }
      lVar47 = lVar47 + 1;
    } while (lVar47 != sweeper.nsemiblock);
  }
  return;
}

Assistant:

TARGET_HD void Sweeper_sweep_block_impl(
  SweeperLite            sweeper,
        P* __restrict__  vo,
  const P* __restrict__  vi,
        P* __restrict__  facexy,
        P* __restrict__  facexz,
        P* __restrict__  faceyz,
  const P* __restrict__  a_from_m,
  const P* __restrict__  m_from_a,
  int                    step,
  const Quantities       quan,
  Bool_t                 proc_x_min,
  Bool_t                 proc_x_max,
  Bool_t                 proc_y_min,
  Bool_t                 proc_y_max,
  StepInfoAll            stepinfoall,
  unsigned long int      do_block_init )
{
  /*---Declarations---*/
    const int noctant_per_block = sweeper.noctant_per_block;

    const int nsemiblock = sweeper.nsemiblock;

    int semiblock_step = 0;

    /*=========================================================================
    =    OpenMP-parallelizing octants leads to the problem that for the same
    =    step, two octants may be updating the same location in a state vector.
    =
    =    One solution is to make the state vector update atomic, which is
    =    likely to be inefficient depending on the system.
    =
    =    The alternative used here is to break the step into sub steps
    =    and break the block into subregions such that during a sub-step,
    =    different octants in different threads update disjoint subregions.
    =
    =    First, note that octants are assigned to threads as follows:
    =      nthread_octant==1: one thread for all octants.
    =      nthread_octant==2: -x and +x octants assigned to different threads.
    =      nthread_octant==4: -y and +y octants also have different threads.
    =      nthread_octant==8: -z and +z octants also have different threads.
    =
    =    Along each coordinate axis for which two threads are assigned,
    =    the block is divided into two halves.  This gives a set of semiblocks.
    =
    =    The semiblocks are visited by the semiblock loop in an ordering
    =    which is lexicographical, either forward or reverse direction
    =    depending on the direction specified by that octant along the axis.
    =    This is set up so that (1) the disjointness condition described
    =    above holds, and (2) the cells are visited in an order that
    =    satisfies the sweep recursion.
    =
    =    NOTES:
    =    - For the unthreaded case, nsemiblock and noctant_per_block
    =      can be set to any of the allowed values and the algorithm will
    =      work properly.
    =    - If nsemiblock==noctant_per_block, then any value of nthread_octant
    =      applied to the OpenMP loop will work ok.
    =    - If nsemiblock<noctant_per_block==nthread_octant, then
    =      a potential race condition will occur.  This can be fixed by
    =      making the update of vo at the end of Sweeper_sweep_semiblock atomic.
    =      What is in question here is the overhead of the semiblock loop.
    =      One might want to reduce the number of semiblocks while keeping
    =      noctant_per_block==nthread_octant high to get more thread
    =      parallelism but possibly not too high so as to control the
    =      wavefront latency.
    =========================================================================*/

    /*--------------------*/
    /*---Loop over semiblock steps---*/
    /*--------------------*/

    for( semiblock_step=0; semiblock_step<nsemiblock; ++semiblock_step )
    {
#ifdef USE_OPENMP_TASKS
      /*--------------------*/
      /*---Enter parallel region where tasks will be launched---*/
      /*--------------------*/

      int thread_octant = 0;
      int thread_e = 0;

#pragma omp parallel for firstprivate(sweeper) collapse(2)
      for( thread_octant=0; thread_octant<sweeper.nthread_octant;
                                                             ++thread_octant)
      {
      for( thread_e=0; thread_e<sweeper.nthread_e; ++thread_e)
      {
        sweeper.thread_octant = thread_octant;
        sweeper.thread_e = thread_e;

      /*--------------------*/
      /*---Loop over the space of all tasks to be launched---*/
      /*--------------------*/

      /*---Here we assign one thread/task per subblock---*/

      int thread_z = 0;
      for( thread_z=0; thread_z<sweeper.nthread_z; ++thread_z)
      {
        sweeper.thread_z = thread_z;

      int thread_y = 0;
      for( thread_y=0; thread_y<sweeper.nthread_y; ++thread_y)
      {
        sweeper.thread_y = thread_y;

      int thread_x = 0;
      for( thread_x=0; thread_x<sweeper.nthread_x; ++thread_x)
      {
        sweeper.thread_x = thread_x;

      /*--------------------*/
      /*---Determine dependencies---*/
      /*--------------------*/

      const char* __restrict__ dep_in_x = Sweeper_task_dependency( &sweeper,
                thread_x-1, thread_y,   thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_y = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y-1, thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_z = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z-1, thread_e, thread_octant );

      const char* __restrict__ dep_out = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z,   thread_e, thread_octant );

      /*
        printf("%i %i "
               "Submitting task %i %i %i %i %i  thread %i numthreads %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num(), omp_get_num_threads());
      */

      /*--------------------*/
      /*---Launch this task---*/
      /*--------------------*/

#pragma omp task \
      depend(in:  dep_in_x[0]) \
      depend(in:  dep_in_y[0]) \
      depend(in:  dep_in_z[0]) \
      depend(out: dep_out[0])
      {
      /*
        printf("%i %i                   "
               "Commencing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */
#endif

      /*--------------------*/
      /*---Loop over octants in octant block---*/
      /*---That is, octants that are computed for this semiblock step---*/
      /*--------------------*/

        const int octant_in_block_min =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper )     ) )
                           /     sweeper.nthread_octant;
        const int octant_in_block_max =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper ) + 1 ) )
                           /     sweeper.nthread_octant;

        int octant_in_block = 0;

      for( octant_in_block=octant_in_block_min;
           octant_in_block<octant_in_block_max; ++octant_in_block )
      {
        /*---Get step info---*/

        const StepInfo stepinfo = stepinfoall.stepinfo[octant_in_block];

        const Bool_t is_octant_active = stepinfo.is_active;

        const int dir_x = Dir_x( stepinfo.octant );
        const int dir_y = Dir_y( stepinfo.octant );
        const int dir_z = Dir_z( stepinfo.octant );

        /*--------------------*/
        /*---Compute semiblock bounds---*/
        /*--------------------*/

        Bool_t is_semiblock_min_x = 0, is_semiblock_max_x = 0;
        int ixmin_semiblock = 0, ixmax_semiblock = 0, ixmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_x, &is_semiblock_max_x,
          &ixmin_semiblock, &ixmax_semiblock, &ixmax_semiblock_up2,
          sweeper.dims_b.ncell_x, DIM_X, dir_x, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_y = 0, is_semiblock_max_y = 0;
        int iymin_semiblock = 0, iymax_semiblock = 0, iymax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_y, &is_semiblock_max_y,
          &iymin_semiblock, &iymax_semiblock, &iymax_semiblock_up2,
          sweeper.dims_b.ncell_y, DIM_Y, dir_y, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_z = 0, is_semiblock_max_z = 0;
        int izmin_semiblock = 0, izmax_semiblock = 0, izmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_z, &is_semiblock_max_z,
          &izmin_semiblock, &izmax_semiblock, &izmax_semiblock_up2,
          sweeper.dims_b.ncell_z, DIM_Z, dir_z, semiblock_step, nsemiblock);

        /*--------------------*/
        /*---Perform sweep over subblocks in semiblock---*/
        /*---(for tasking case, this task sweeps one subblock in semiblock---*/
        /*--------------------*/

        const int iz_base = stepinfo.block_z * sweeper.dims_b.ncell_z;

        const P* vi_this = const_ref_state( vi, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );
        P* vo_this =             ref_state( vo, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );

        const int do_block_init_this = !! ( do_block_init &
                         ( ((unsigned long int)1) <<
                           ( octant_in_block + noctant_per_block *
                             semiblock_step ) ) );

        Sweeper_sweep_semiblock( &sweeper, vo_this, vi_this,
                                 facexy, facexz, faceyz,
                                 a_from_m, m_from_a,
                                 &quan, stepinfo, octant_in_block,
                                 ixmin_semiblock, ixmax_semiblock_up2,
                                 iymin_semiblock, iymax_semiblock_up2,
                                 izmin_semiblock, izmax_semiblock_up2,
                                 do_block_init_this,
                                 is_octant_active );

      } /*---octant_in_block---*/

#ifdef USE_OPENMP_TASKS
      /*
        printf("%i %i                                                 "
               "Completing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */

      } /*---omp task---*/
      }
      }
      }
      }
      } /*---omp parallel for---*/ /*---NOTE: implicit sync here---*/
#else
      /*---Sync between semiblock steps---*/
      Sweeper_sync_octant_threads( &sweeper );
#endif

    } /*---semiblock---*/
}